

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O2

int_fast64_t detzcode64(char *codep)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((byte)*codep & 0x7f);
  for (lVar1 = 1; lVar1 != 8; lVar1 = lVar1 + 1) {
    uVar3 = uVar3 << 8 | (ulong)(byte)codep[lVar1];
  }
  uVar2 = uVar3 ^ 0x8000000000000000;
  if (-1 < *codep) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static int_fast64_t detzcode64( const char * codep )
{
    uint_fast64_t result;
    int           i;
    int_fast64_t  one = 1;
    int_fast64_t  halfmaxval = one << ( 64 - 2 );
    int_fast64_t  maxval = halfmaxval - 1 + halfmaxval;
    int_fast64_t  minval = - _PDCLIB_TWOS_COMPLEMENT - maxval;

    result = codep[ 0 ] & 0x7f;

    for ( i = 1; i < 8; ++i )
    {
        result = ( result << 8 ) | ( codep[ i ] & 0xff );
    }

    if ( codep[ 0 ] & 0x80 )
    {
        /* Do two's-complement negation even on non-two's-complement machines.
           If the result would be minval - 1, return minval.
        */
      result -= ! _PDCLIB_TWOS_COMPLEMENT && result != 0;
      result += minval;
    }

    return result;
}